

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlkf.cpp
# Opt level: O2

UBool __thiscall
icu_63::LocaleKeyFactory::handlesKey(LocaleKeyFactory *this,ICUServiceKey *key,UErrorCode *status)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar2;
  bool bVar3;
  UnicodeString id;
  UnicodeString local_50;
  
  iVar1 = (*(this->super_ICUServiceFactory).super_UObject._vptr_UObject[8])(this,status);
  if ((Hashtable *)CONCAT44(extraout_var,iVar1) == (Hashtable *)0x0) {
    bVar3 = false;
  }
  else {
    local_50.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b1268;
    local_50.fUnion.fStackFields.fLengthAndFlags = 2;
    (*(key->super_UObject)._vptr_UObject[5])(key);
    pvVar2 = Hashtable::get((Hashtable *)CONCAT44(extraout_var,iVar1),&local_50);
    bVar3 = pvVar2 != (void *)0x0;
    UnicodeString::~UnicodeString(&local_50);
  }
  return bVar3;
}

Assistant:

UBool
LocaleKeyFactory::handlesKey(const ICUServiceKey& key, UErrorCode& status) const {
    const Hashtable* supported = getSupportedIDs(status);
    if (supported) {
        UnicodeString id;
        key.currentID(id);
        return supported->get(id) != NULL;
    }
    return FALSE;
}